

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serializer.cpp
# Opt level: O0

void __thiscall FSerializer::EndObject(FSerializer *this)

{
  bool bVar1;
  FSerializer *this_local;
  
  bVar1 = isWriting(this);
  if (bVar1) {
    bVar1 = FWriter::inObject(this->w);
    if (!bVar1) {
      __assert_fail("false && \"EndObject call not inside an object\"",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/serializer.cpp"
                    ,0x26e,"void FSerializer::EndObject()");
    }
    FWriter::EndObject(this->w);
    TArray<bool,_bool>::Pop(&this->w->mInObject);
  }
  else {
    TArray<FJSONObject,_FJSONObject>::Pop(&this->r->mObjects);
  }
  return;
}

Assistant:

void FSerializer::EndObject()
{
	if (isWriting())
	{
		if (w->inObject())
		{
			w->EndObject();
			w->mInObject.Pop();
		}
		else
		{
			assert(false && "EndObject call not inside an object");
			I_Error("EndObject call not inside an object");
		}
	}
	else
	{
		r->mObjects.Pop();
	}
}